

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

GLint __thiscall irr::video::COpenGLDriver::getTextureWrapMode(COpenGLDriver *this,u8 clamp)

{
  GLint GVar1;
  GLint GVar2;
  undefined7 in_register_00000031;
  bool bVar3;
  
  switch((int)CONCAT71(in_register_00000031,clamp)) {
  case 1:
    return 0x2900;
  case 2:
    if (0x65 < *(ushort *)&this->field_0x4d0) {
      return 0x812f;
    }
    bVar3 = this->field_0x680 == '\0';
    GVar2 = 0x812f;
    break;
  case 3:
    if (0x66 < *(ushort *)&this->field_0x4d0) {
      return 0x812d;
    }
    if (this->field_0x560 != '\0') {
      return 0x812d;
    }
    bVar3 = this->field_0x67e == '\0';
    GVar2 = 0x812d;
    break;
  case 4:
    if (0x67 < *(ushort *)&this->field_0x4d0) {
      return 0x8370;
    }
    if (this->field_0x570 != '\0') {
      return 0x8370;
    }
    bVar3 = this->field_0x608 == '\0';
    GVar2 = 0x8370;
    GVar1 = 0x2901;
    goto LAB_001e5a15;
  case 5:
    if (this->field_0x5ee != '\0') {
      return 0x8742;
    }
    bVar3 = this->field_0x59b == '\0';
    GVar2 = 0x8742;
    break;
  case 6:
    if (this->field_0x5ee != '\0') {
      return 0x8743;
    }
    bVar3 = this->field_0x59b == '\0';
    GVar2 = 0x8743;
    break;
  case 7:
    bVar3 = this->field_0x5ee == '\0';
    GVar2 = 0x8912;
    break;
  default:
    return 0x2901;
  }
  GVar1 = 0x2900;
LAB_001e5a15:
  if (!bVar3) {
    GVar1 = GVar2;
  }
  return GVar1;
}

Assistant:

GLint COpenGLDriver::getTextureWrapMode(const u8 clamp)
{
	GLint mode = GL_REPEAT;
	switch (clamp) {
	case ETC_REPEAT:
		mode = GL_REPEAT;
		break;
	case ETC_CLAMP:
		mode = GL_CLAMP;
		break;
	case ETC_CLAMP_TO_EDGE:
#ifdef GL_VERSION_1_2
		if (Version > 101)
			mode = GL_CLAMP_TO_EDGE;
		else
#endif
#ifdef GL_SGIS_texture_edge_clamp
				if (FeatureAvailable[IRR_SGIS_texture_edge_clamp])
			mode = GL_CLAMP_TO_EDGE_SGIS;
		else
#endif
			// fallback
			mode = GL_CLAMP;
		break;
	case ETC_CLAMP_TO_BORDER:
#ifdef GL_VERSION_1_3
		if (Version > 102)
			mode = GL_CLAMP_TO_BORDER;
		else
#endif
#ifdef GL_ARB_texture_border_clamp
				if (FeatureAvailable[IRR_ARB_texture_border_clamp])
			mode = GL_CLAMP_TO_BORDER_ARB;
		else
#endif
#ifdef GL_SGIS_texture_border_clamp
				if (FeatureAvailable[IRR_SGIS_texture_border_clamp])
			mode = GL_CLAMP_TO_BORDER_SGIS;
		else
#endif
			// fallback
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR:
#ifdef GL_VERSION_1_4
		if (Version > 103)
			mode = GL_MIRRORED_REPEAT;
		else
#endif
#ifdef GL_ARB_texture_border_clamp
				if (FeatureAvailable[IRR_ARB_texture_mirrored_repeat])
			mode = GL_MIRRORED_REPEAT_ARB;
		else
#endif
#ifdef GL_IBM_texture_mirrored_repeat
				if (FeatureAvailable[IRR_IBM_texture_mirrored_repeat])
			mode = GL_MIRRORED_REPEAT_IBM;
		else
#endif
			mode = GL_REPEAT;
		break;
	case ETC_MIRROR_CLAMP:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_EXT;
		else
#endif
#if defined(GL_ATI_texture_mirror_once)
				if (FeatureAvailable[IRR_ATI_texture_mirror_once])
			mode = GL_MIRROR_CLAMP_ATI;
		else
#endif
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR_CLAMP_TO_EDGE:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_TO_EDGE_EXT;
		else
#endif
#if defined(GL_ATI_texture_mirror_once)
				if (FeatureAvailable[IRR_ATI_texture_mirror_once])
			mode = GL_MIRROR_CLAMP_TO_EDGE_ATI;
		else
#endif
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR_CLAMP_TO_BORDER:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_TO_BORDER_EXT;
		else
#endif
			mode = GL_CLAMP;
		break;
	}
	return mode;
}